

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnTableInitExpr
          (BinaryReaderInterp *this,Index segment_index,Index table_index)

{
  Index index;
  Index index_00;
  bool bVar1;
  Location local_118;
  Var local_f8;
  Location local_b0;
  Var local_90;
  Location local_48;
  Enum local_24;
  Index local_20;
  Index local_1c;
  Index table_index_local;
  Index segment_index_local;
  BinaryReaderInterp *this_local;
  
  local_20 = table_index;
  local_1c = segment_index;
  _table_index_local = this;
  GetLocation(&local_48,this);
  index_00 = local_1c;
  GetLocation(&local_b0,this);
  Var::Var(&local_90,index_00,&local_b0);
  index = local_20;
  GetLocation(&local_118,this);
  Var::Var(&local_f8,index,&local_118);
  local_24 = (Enum)SharedValidator::OnTableInit(&this->validator_,&local_48,&local_90,&local_f8);
  bVar1 = Failed((Result)local_24);
  Var::~Var(&local_f8);
  Var::~Var(&local_90);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Istream::Emit(this->istream_,TableInit,local_20,local_1c);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnTableInitExpr(Index segment_index,
                                           Index table_index) {
  CHECK_RESULT(validator_.OnTableInit(GetLocation(),
                                      Var(segment_index, GetLocation()),
                                      Var(table_index, GetLocation())));
  istream_.Emit(Opcode::TableInit, table_index, segment_index);
  return Result::Ok;
}